

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  U32 *pUVar9;
  BYTE *pBVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  byte bVar20;
  seqDef *psVar21;
  BYTE *pStart_1;
  ulong uVar22;
  U32 UVar23;
  ulong *puVar24;
  int iVar25;
  int *piVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  int *piVar31;
  int iVar32;
  ulong uVar33;
  ulong *puVar34;
  ulong *puVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  uint local_bc;
  ulong local_b8;
  BYTE *litLimit_w_1;
  BYTE *base;
  BYTE *litLimit_w;
  BYTE *pInLoopLimit_2;
  BYTE *ilimit;
  BYTE *iend;
  U32 *hashTable;
  U32 prefixStartIndex;
  BYTE *prefixStart;
  size_t stepSize;
  
  pBVar8 = (ms->window).base;
  puVar2 = (ulong *)((long)src + srcSize);
  iVar32 = (int)pBVar8;
  iVar25 = (int)puVar2 - iVar32;
  uVar6 = (ms->window).dictLimit;
  uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar13 = iVar25 - uVar27;
  if (iVar25 - uVar6 <= uVar27) {
    uVar13 = uVar6;
  }
  if (ms->loadedDictEnd != 0) {
    uVar13 = uVar6;
  }
  piVar26 = (int *)(pBVar8 + uVar13);
  puVar24 = (ulong *)((ulong)(piVar26 == (int *)src) + (long)src);
  iVar25 = (int)puVar24 - iVar32;
  uVar36 = iVar25 - uVar27;
  if (iVar25 - uVar6 <= uVar27) {
    uVar36 = uVar6;
  }
  if (ms->loadedDictEnd != 0) {
    uVar36 = uVar6;
  }
  uVar6 = (ms->cParams).targetLength;
  uVar14 = (ulong)(uVar6 + 1 + (uint)(uVar6 == 0));
  puVar15 = (ulong *)((long)src + (srcSize - 8));
  uVar36 = iVar25 - uVar36;
  uVar6 = rep[1];
  local_b8 = (ulong)uVar6;
  if (uVar36 < uVar6) {
    local_b8 = 0;
  }
  uVar28 = (uint)local_b8;
  uVar27 = *rep;
  local_bc = 0;
  if (uVar27 <= uVar36) {
    local_bc = uVar27;
  }
  puVar18 = (ulong *)((long)src + (ulong)(piVar26 == (int *)src) + 1);
  uVar7 = (ms->cParams).minMatch;
  pUVar9 = ms->hashTable;
  if (uVar7 == 5) {
    if (puVar18 < puVar15) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar19 = puVar2 + -4;
      do {
        uVar22 = *puVar24;
        uVar16 = uVar22 * -0x30e4432345000000 >> (bVar20 & 0x3f);
        uVar33 = *puVar18;
        uVar30 = uVar33 * -0x30e4432345000000 >> (bVar20 & 0x3f);
        uVar28 = pUVar9[uVar16];
        uVar7 = pUVar9[uVar30];
        UVar23 = (U32)((long)puVar24 - (long)pBVar8);
        pUVar9[uVar16] = UVar23;
        pUVar9[uVar30] = (int)puVar18 - iVar32;
        if ((local_bc == 0) ||
           (piVar31 = (int *)((long)puVar24 + (2 - (ulong)local_bc)),
           *piVar31 != *(int *)((long)puVar24 + 2))) {
          if (((uVar13 < uVar28) &&
              (piVar31 = (int *)(pBVar8 + uVar28), puVar17 = puVar24, *piVar31 == (int)uVar22)) ||
             ((uVar13 < uVar7 &&
              (piVar31 = (int *)(pBVar8 + uVar7), puVar17 = puVar18, *piVar31 == (int)uVar33)))) {
            uVar28 = (int)puVar17 - (int)piVar31;
            iVar25 = uVar28 + 2;
            uVar22 = 4;
            while ((piVar26 < piVar31 && (src < puVar17))) {
              if (*(char *)((long)puVar17 + -1) != *(char *)((long)piVar31 + -1)) {
                local_b8 = (ulong)local_bc;
                goto LAB_001c6011;
              }
              uVar22 = uVar22 + 1;
              puVar17 = (ulong *)((long)puVar17 + -1);
              piVar31 = (int *)((long)piVar31 + -1);
            }
            local_b8 = (ulong)local_bc;
            goto LAB_001c6011;
          }
          lVar37 = ((ulong)((long)puVar24 - (long)src) >> 7) + uVar14;
          puVar24 = (ulong *)((long)puVar24 + lVar37);
          puVar18 = (ulong *)((long)puVar18 + lVar37);
        }
        else {
          uVar22 = (ulong)(*(char *)((long)puVar24 + 1) == *(char *)((long)piVar31 + -1));
          puVar17 = (ulong *)((long)puVar24 + (2 - uVar22));
          piVar31 = (int *)((long)piVar31 - uVar22);
          uVar22 = uVar22 | 4;
          iVar25 = 0;
          uVar28 = local_bc;
LAB_001c6011:
          puVar18 = (ulong *)((long)puVar17 + uVar22);
          puVar35 = (ulong *)((long)piVar31 + uVar22);
          puVar34 = puVar18;
          if (puVar18 < puVar1) {
            if (*puVar35 == *puVar18) {
              lVar37 = 0;
              do {
                puVar35 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                if (puVar1 <= puVar35) {
                  puVar35 = (ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                  puVar34 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                  goto LAB_001c60b0;
                }
                uVar33 = *(ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                uVar16 = *puVar35;
                lVar37 = lVar37 + 8;
              } while (uVar33 == uVar16);
              uVar16 = uVar16 ^ uVar33;
              uVar33 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = (uVar33 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar16 = *puVar18 ^ *puVar35;
              uVar33 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = uVar33 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c60b0:
            if ((puVar34 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar35 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar35 = (ulong *)((long)puVar35 + 4);
            }
            if ((puVar34 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar35 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar35 = (ulong *)((long)puVar35 + 2);
            }
            if (puVar34 < puVar2) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar35 == (char)*puVar34));
            }
            uVar33 = (long)puVar34 - (long)puVar18;
          }
          uVar16 = (long)puVar17 - (long)src;
          puVar18 = (ulong *)seqStore->lit;
          if (puVar19 < puVar17) {
            puVar35 = puVar18;
            puVar34 = (ulong *)src;
            if (src <= puVar19) {
              puVar35 = (ulong *)((long)puVar18 + ((long)puVar19 - (long)src));
              uVar30 = *(ulong *)((long)src + 8);
              *puVar18 = *src;
              puVar18[1] = uVar30;
              puVar34 = puVar19;
              if (0x10 < (long)puVar19 - (long)src) {
                lVar37 = 0x10;
                do {
                  uVar11 = ((undefined8 *)((long)src + lVar37))[1];
                  puVar4 = (undefined8 *)((long)puVar18 + lVar37);
                  *puVar4 = *(undefined8 *)((long)src + lVar37);
                  puVar4[1] = uVar11;
                  puVar5 = (undefined8 *)((long)src + lVar37 + 0x10);
                  uVar11 = puVar5[1];
                  puVar4[2] = *puVar5;
                  puVar4[3] = uVar11;
                  lVar37 = lVar37 + 0x20;
                } while (puVar4 + 4 < puVar35);
              }
            }
            if (puVar34 < puVar17) {
              lVar37 = 0;
              do {
                *(undefined1 *)((long)puVar35 + lVar37) = *(undefined1 *)((long)puVar34 + lVar37);
                lVar37 = lVar37 + 1;
              } while ((long)puVar17 - (long)puVar34 != lVar37);
            }
LAB_001c61fc:
            seqStore->lit = seqStore->lit + uVar16;
            psVar21 = seqStore->sequences;
            if (0xffff < uVar16) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar30 = *(ulong *)((long)src + 8);
            *puVar18 = *src;
            puVar18[1] = uVar30;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar16) {
              uVar30 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar10 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar10 + 0x18) = uVar30;
              if (0x20 < (long)uVar16) {
                lVar37 = 0;
                do {
                  puVar4 = (undefined8 *)((long)src + lVar37 + 0x20);
                  uVar11 = puVar4[1];
                  pBVar3 = pBVar10 + lVar37 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar4 = (undefined8 *)((long)src + lVar37 + 0x30);
                  uVar11 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar37 = lVar37 + 0x20;
                } while (pBVar3 + 0x20 < pBVar10 + uVar16);
              }
              goto LAB_001c61fc;
            }
            seqStore->lit = pBVar10 + uVar16;
            psVar21 = seqStore->sequences;
          }
          uVar30 = (uVar33 + uVar22) - 3;
          psVar21->litLength = (U16)uVar16;
          psVar21->offset = iVar25 + 1;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar21->matchLength = (U16)uVar30;
          psVar21 = psVar21 + 1;
          seqStore->sequences = psVar21;
          src = (void *)((long)puVar17 + uVar33 + uVar22);
          if (src <= puVar15) {
            pUVar9[(ulong)(*(long *)(pBVar8 + ((long)puVar24 - (long)pBVar8 & 0xffffffffU) + 2) *
                          -0x30e4432345000000) >> (bVar20 & 0x3f)] = UVar23 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar20 & 0x3f)] =
                 ((int)src + -2) - iVar32;
            if ((int)local_b8 == 0) {
              local_b8 = 0;
            }
            else {
              uVar22 = (ulong)uVar28;
              do {
                uVar33 = local_b8;
                local_b8 = uVar33;
                uVar28 = (uint)uVar22;
                if ((int)*src != *(int *)((long)src - uVar33)) break;
                lVar37 = -uVar33;
                puVar24 = (ulong *)((long)src + 4);
                puVar17 = (ulong *)((long)src + lVar37 + 4);
                puVar18 = puVar24;
                if (puVar24 < puVar1) {
                  if (*puVar17 == *puVar24) {
                    lVar38 = 0;
                    do {
                      puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                      if (puVar1 <= puVar18) {
                        puVar17 = (ulong *)((long)src + lVar37 + lVar38 + 0xc);
                        puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                        goto LAB_001c638f;
                      }
                      uVar16 = *(ulong *)((long)src + lVar38 + lVar37 + 0xc);
                      uVar30 = *puVar18;
                      lVar38 = lVar38 + 8;
                    } while (uVar16 == uVar30);
                    uVar30 = uVar30 ^ uVar16;
                    uVar16 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar38;
                  }
                  else {
                    uVar30 = *puVar24 ^ *puVar17;
                    uVar16 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    uVar16 = uVar16 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c638f:
                  if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar18))
                  {
                    puVar18 = (ulong *)((long)puVar18 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar18 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar18)) {
                    puVar18 = (ulong *)((long)puVar18 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar18 < puVar2) {
                    puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar17 == (char)*puVar18));
                  }
                  uVar16 = (long)puVar18 - (long)puVar24;
                }
                pUVar9[*src * -0x30e4432345000000 >> (bVar20 & 0x3f)] = (int)src - iVar32;
                if (src <= puVar19) {
                  puVar24 = (ulong *)seqStore->lit;
                  uVar30 = *(ulong *)((long)src + 8);
                  *puVar24 = *src;
                  puVar24[1] = uVar30;
                  psVar21 = seqStore->sequences;
                }
                psVar21->litLength = 0;
                psVar21->offset = 1;
                if (0xffff < uVar16 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
                }
                src = (void *)((long)src + uVar16 + 4);
                psVar21->matchLength = (U16)(uVar16 + 1);
                psVar21 = psVar21 + 1;
                seqStore->sequences = psVar21;
                local_b8 = uVar22;
                uVar22 = uVar33;
                uVar28 = (uint)uVar33;
              } while (src <= puVar15);
            }
          }
          puVar18 = (ulong *)((long)src + 1);
          puVar24 = (ulong *)src;
          local_bc = uVar28;
        }
        uVar28 = (uint)local_b8;
      } while (puVar18 < puVar15);
    }
  }
  else if (uVar7 == 6) {
    if (puVar18 < puVar15) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar19 = puVar2 + -4;
      do {
        uVar22 = *puVar24;
        uVar16 = uVar22 * -0x30e4432340650000 >> (bVar20 & 0x3f);
        uVar33 = *puVar18;
        uVar30 = uVar33 * -0x30e4432340650000 >> (bVar20 & 0x3f);
        uVar28 = pUVar9[uVar16];
        uVar7 = pUVar9[uVar30];
        UVar23 = (U32)((long)puVar24 - (long)pBVar8);
        pUVar9[uVar16] = UVar23;
        pUVar9[uVar30] = (int)puVar18 - iVar32;
        if ((local_bc == 0) ||
           (piVar31 = (int *)((long)puVar24 + (2 - (ulong)local_bc)),
           *piVar31 != *(int *)((long)puVar24 + 2))) {
          if (((uVar13 < uVar28) &&
              (piVar31 = (int *)(pBVar8 + uVar28), puVar17 = puVar24, *piVar31 == (int)uVar22)) ||
             ((uVar13 < uVar7 &&
              (piVar31 = (int *)(pBVar8 + uVar7), puVar17 = puVar18, *piVar31 == (int)uVar33)))) {
            uVar28 = (int)puVar17 - (int)piVar31;
            iVar25 = uVar28 + 2;
            uVar22 = 4;
            while ((piVar26 < piVar31 && (src < puVar17))) {
              if (*(char *)((long)puVar17 + -1) != *(char *)((long)piVar31 + -1)) {
                local_b8 = (ulong)local_bc;
                goto LAB_001c59e5;
              }
              uVar22 = uVar22 + 1;
              puVar17 = (ulong *)((long)puVar17 + -1);
              piVar31 = (int *)((long)piVar31 + -1);
            }
            local_b8 = (ulong)local_bc;
            goto LAB_001c59e5;
          }
          lVar37 = ((ulong)((long)puVar24 - (long)src) >> 7) + uVar14;
          puVar24 = (ulong *)((long)puVar24 + lVar37);
          puVar18 = (ulong *)((long)puVar18 + lVar37);
        }
        else {
          uVar22 = (ulong)(*(char *)((long)puVar24 + 1) == *(char *)((long)piVar31 + -1));
          puVar17 = (ulong *)((long)puVar24 + (2 - uVar22));
          piVar31 = (int *)((long)piVar31 - uVar22);
          uVar22 = uVar22 | 4;
          iVar25 = 0;
          uVar28 = local_bc;
LAB_001c59e5:
          puVar18 = (ulong *)((long)puVar17 + uVar22);
          puVar35 = (ulong *)((long)piVar31 + uVar22);
          puVar34 = puVar18;
          if (puVar18 < puVar1) {
            if (*puVar35 == *puVar18) {
              lVar37 = 0;
              do {
                puVar35 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                if (puVar1 <= puVar35) {
                  puVar35 = (ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                  puVar34 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                  goto LAB_001c5a90;
                }
                uVar33 = *(ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                uVar16 = *puVar35;
                lVar37 = lVar37 + 8;
              } while (uVar33 == uVar16);
              uVar16 = uVar16 ^ uVar33;
              uVar33 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = (uVar33 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar16 = *puVar18 ^ *puVar35;
              uVar33 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = uVar33 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c5a90:
            if ((puVar34 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar35 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar35 = (ulong *)((long)puVar35 + 4);
            }
            if ((puVar34 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar35 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar35 = (ulong *)((long)puVar35 + 2);
            }
            if (puVar34 < puVar2) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar35 == (char)*puVar34));
            }
            uVar33 = (long)puVar34 - (long)puVar18;
          }
          uVar16 = (long)puVar17 - (long)src;
          puVar18 = (ulong *)seqStore->lit;
          if (puVar19 < puVar17) {
            puVar35 = puVar18;
            puVar34 = (ulong *)src;
            if (src <= puVar19) {
              puVar35 = (ulong *)((long)puVar18 + ((long)puVar19 - (long)src));
              uVar30 = *(ulong *)((long)src + 8);
              *puVar18 = *src;
              puVar18[1] = uVar30;
              puVar34 = puVar19;
              if (0x10 < (long)puVar19 - (long)src) {
                lVar37 = 0x10;
                do {
                  uVar11 = ((undefined8 *)((long)src + lVar37))[1];
                  puVar4 = (undefined8 *)((long)puVar18 + lVar37);
                  *puVar4 = *(undefined8 *)((long)src + lVar37);
                  puVar4[1] = uVar11;
                  puVar5 = (undefined8 *)((long)src + lVar37 + 0x10);
                  uVar11 = puVar5[1];
                  puVar4[2] = *puVar5;
                  puVar4[3] = uVar11;
                  lVar37 = lVar37 + 0x20;
                } while (puVar4 + 4 < puVar35);
              }
            }
            if (puVar34 < puVar17) {
              lVar37 = 0;
              do {
                *(undefined1 *)((long)puVar35 + lVar37) = *(undefined1 *)((long)puVar34 + lVar37);
                lVar37 = lVar37 + 1;
              } while ((long)puVar17 - (long)puVar34 != lVar37);
            }
LAB_001c5bd9:
            seqStore->lit = seqStore->lit + uVar16;
            psVar21 = seqStore->sequences;
            if (0xffff < uVar16) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar30 = *(ulong *)((long)src + 8);
            *puVar18 = *src;
            puVar18[1] = uVar30;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar16) {
              uVar30 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar10 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar10 + 0x18) = uVar30;
              if (0x20 < (long)uVar16) {
                lVar37 = 0;
                do {
                  puVar4 = (undefined8 *)((long)src + lVar37 + 0x20);
                  uVar11 = puVar4[1];
                  pBVar3 = pBVar10 + lVar37 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar4 = (undefined8 *)((long)src + lVar37 + 0x30);
                  uVar11 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar37 = lVar37 + 0x20;
                } while (pBVar3 + 0x20 < pBVar10 + uVar16);
              }
              goto LAB_001c5bd9;
            }
            seqStore->lit = pBVar10 + uVar16;
            psVar21 = seqStore->sequences;
          }
          uVar30 = (uVar33 + uVar22) - 3;
          psVar21->litLength = (U16)uVar16;
          psVar21->offset = iVar25 + 1;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar21->matchLength = (U16)uVar30;
          psVar21 = psVar21 + 1;
          seqStore->sequences = psVar21;
          src = (void *)((long)puVar17 + uVar33 + uVar22);
          if (src <= puVar15) {
            pUVar9[(ulong)(*(long *)(pBVar8 + ((long)puVar24 - (long)pBVar8 & 0xffffffffU) + 2) *
                          -0x30e4432340650000) >> (bVar20 & 0x3f)] = UVar23 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar20 & 0x3f)] =
                 ((int)src + -2) - iVar32;
            if ((int)local_b8 == 0) {
              local_b8 = 0;
            }
            else {
              uVar22 = (ulong)uVar28;
              do {
                uVar33 = local_b8;
                local_b8 = uVar33;
                uVar28 = (uint)uVar22;
                if ((int)*src != *(int *)((long)src - uVar33)) break;
                lVar37 = -uVar33;
                puVar24 = (ulong *)((long)src + 4);
                puVar17 = (ulong *)((long)src + lVar37 + 4);
                puVar18 = puVar24;
                if (puVar24 < puVar1) {
                  if (*puVar17 == *puVar24) {
                    lVar38 = 0;
                    do {
                      puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                      if (puVar1 <= puVar18) {
                        puVar17 = (ulong *)((long)src + lVar37 + lVar38 + 0xc);
                        puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                        goto LAB_001c5d61;
                      }
                      uVar16 = *(ulong *)((long)src + lVar38 + lVar37 + 0xc);
                      uVar30 = *puVar18;
                      lVar38 = lVar38 + 8;
                    } while (uVar16 == uVar30);
                    uVar30 = uVar30 ^ uVar16;
                    uVar16 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar38;
                  }
                  else {
                    uVar30 = *puVar24 ^ *puVar17;
                    uVar16 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                      }
                    }
                    uVar16 = uVar16 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c5d61:
                  if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar18))
                  {
                    puVar18 = (ulong *)((long)puVar18 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar18 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar18)) {
                    puVar18 = (ulong *)((long)puVar18 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar18 < puVar2) {
                    puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar17 == (char)*puVar18));
                  }
                  uVar16 = (long)puVar18 - (long)puVar24;
                }
                pUVar9[*src * -0x30e4432340650000 >> (bVar20 & 0x3f)] = (int)src - iVar32;
                if (src <= puVar19) {
                  puVar24 = (ulong *)seqStore->lit;
                  uVar30 = *(ulong *)((long)src + 8);
                  *puVar24 = *src;
                  puVar24[1] = uVar30;
                  psVar21 = seqStore->sequences;
                }
                psVar21->litLength = 0;
                psVar21->offset = 1;
                if (0xffff < uVar16 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
                }
                src = (void *)((long)src + uVar16 + 4);
                psVar21->matchLength = (U16)(uVar16 + 1);
                psVar21 = psVar21 + 1;
                seqStore->sequences = psVar21;
                local_b8 = uVar22;
                uVar22 = uVar33;
                uVar28 = (uint)uVar33;
              } while (src <= puVar15);
            }
          }
          puVar18 = (ulong *)((long)src + 1);
          puVar24 = (ulong *)src;
          local_bc = uVar28;
        }
        uVar28 = (uint)local_b8;
      } while (puVar18 < puVar15);
    }
  }
  else if (uVar7 == 7) {
    if (puVar18 < puVar15) {
      bVar20 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar19 = puVar2 + -4;
      do {
        uVar22 = *puVar24;
        uVar16 = uVar22 * -0x30e44323405a9d00 >> (bVar20 & 0x3f);
        uVar33 = *puVar18;
        uVar30 = uVar33 * -0x30e44323405a9d00 >> (bVar20 & 0x3f);
        uVar28 = pUVar9[uVar16];
        uVar7 = pUVar9[uVar30];
        UVar23 = (U32)((long)puVar24 - (long)pBVar8);
        pUVar9[uVar16] = UVar23;
        pUVar9[uVar30] = (int)puVar18 - iVar32;
        if ((local_bc == 0) ||
           (piVar31 = (int *)((long)puVar24 + (2 - (ulong)local_bc)),
           *piVar31 != *(int *)((long)puVar24 + 2))) {
          if (((uVar13 < uVar28) &&
              (piVar31 = (int *)(pBVar8 + uVar28), puVar17 = puVar24, *piVar31 == (int)uVar22)) ||
             ((uVar13 < uVar7 &&
              (piVar31 = (int *)(pBVar8 + uVar7), puVar17 = puVar18, *piVar31 == (int)uVar33)))) {
            uVar28 = (int)puVar17 - (int)piVar31;
            iVar25 = uVar28 + 2;
            uVar22 = 4;
            while ((piVar26 < piVar31 && (src < puVar17))) {
              if (*(char *)((long)puVar17 + -1) != *(char *)((long)piVar31 + -1)) {
                local_b8 = (ulong)local_bc;
                goto LAB_001c53e2;
              }
              uVar22 = uVar22 + 1;
              puVar17 = (ulong *)((long)puVar17 + -1);
              piVar31 = (int *)((long)piVar31 + -1);
            }
            local_b8 = (ulong)local_bc;
            goto LAB_001c53e2;
          }
          lVar37 = ((ulong)((long)puVar24 - (long)src) >> 7) + uVar14;
          puVar24 = (ulong *)((long)puVar24 + lVar37);
          puVar18 = (ulong *)((long)puVar18 + lVar37);
        }
        else {
          uVar22 = (ulong)(*(char *)((long)puVar24 + 1) == *(char *)((long)piVar31 + -1));
          puVar17 = (ulong *)((long)puVar24 + (2 - uVar22));
          piVar31 = (int *)((long)piVar31 - uVar22);
          uVar22 = uVar22 | 4;
          iVar25 = 0;
          uVar28 = local_bc;
LAB_001c53e2:
          puVar18 = (ulong *)((long)puVar17 + uVar22);
          puVar35 = (ulong *)((long)piVar31 + uVar22);
          puVar34 = puVar18;
          if (puVar18 < puVar1) {
            if (*puVar35 == *puVar18) {
              lVar37 = 0;
              do {
                puVar35 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                if (puVar1 <= puVar35) {
                  puVar35 = (ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                  puVar34 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                  goto LAB_001c5477;
                }
                uVar33 = *(ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                uVar16 = *puVar35;
                lVar37 = lVar37 + 8;
              } while (uVar33 == uVar16);
              uVar16 = uVar16 ^ uVar33;
              uVar33 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = (uVar33 >> 3 & 0x1fffffff) + lVar37;
            }
            else {
              uVar16 = *puVar18 ^ *puVar35;
              uVar33 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar33 = uVar33 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c5477:
            if ((puVar34 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar35 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar35 = (ulong *)((long)puVar35 + 4);
            }
            if ((puVar34 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar35 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar35 = (ulong *)((long)puVar35 + 2);
            }
            if (puVar34 < puVar2) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar35 == (char)*puVar34));
            }
            uVar33 = (long)puVar34 - (long)puVar18;
          }
          uVar16 = (long)puVar17 - (long)src;
          puVar18 = (ulong *)seqStore->lit;
          if (puVar19 < puVar17) {
            puVar35 = puVar18;
            puVar34 = (ulong *)src;
            if (src <= puVar19) {
              puVar35 = (ulong *)((long)puVar18 + ((long)puVar19 - (long)src));
              uVar30 = *(ulong *)((long)src + 8);
              *puVar18 = *src;
              puVar18[1] = uVar30;
              puVar34 = puVar19;
              if (0x10 < (long)puVar19 - (long)src) {
                lVar37 = 0x10;
                do {
                  uVar11 = ((undefined8 *)((long)src + lVar37))[1];
                  puVar4 = (undefined8 *)((long)puVar18 + lVar37);
                  *puVar4 = *(undefined8 *)((long)src + lVar37);
                  puVar4[1] = uVar11;
                  puVar5 = (undefined8 *)((long)src + lVar37 + 0x10);
                  uVar11 = puVar5[1];
                  puVar4[2] = *puVar5;
                  puVar4[3] = uVar11;
                  lVar37 = lVar37 + 0x20;
                } while (puVar4 + 4 < puVar35);
              }
            }
            if (puVar34 < puVar17) {
              lVar37 = 0;
              do {
                *(undefined1 *)((long)puVar35 + lVar37) = *(undefined1 *)((long)puVar34 + lVar37);
                lVar37 = lVar37 + 1;
              } while ((long)puVar17 - (long)puVar34 != lVar37);
            }
LAB_001c55c0:
            seqStore->lit = seqStore->lit + uVar16;
            psVar21 = seqStore->sequences;
            if (0xffff < uVar16) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar30 = *(ulong *)((long)src + 8);
            *puVar18 = *src;
            puVar18[1] = uVar30;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar16) {
              uVar30 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar10 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar10 + 0x18) = uVar30;
              if (0x20 < (long)uVar16) {
                lVar37 = 0;
                do {
                  puVar4 = (undefined8 *)((long)src + lVar37 + 0x20);
                  uVar11 = puVar4[1];
                  pBVar3 = pBVar10 + lVar37 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar4;
                  *(undefined8 *)(pBVar3 + 8) = uVar11;
                  puVar4 = (undefined8 *)((long)src + lVar37 + 0x30);
                  uVar11 = puVar4[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                  lVar37 = lVar37 + 0x20;
                } while (pBVar3 + 0x20 < pBVar10 + uVar16);
              }
              goto LAB_001c55c0;
            }
            seqStore->lit = pBVar10 + uVar16;
            psVar21 = seqStore->sequences;
          }
          uVar30 = (uVar33 + uVar22) - 3;
          psVar21->litLength = (U16)uVar16;
          psVar21->offset = iVar25 + 1;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar21->matchLength = (U16)uVar30;
          psVar21 = psVar21 + 1;
          seqStore->sequences = psVar21;
          src = (void *)((long)puVar17 + uVar33 + uVar22);
          if (src <= puVar15) {
            pUVar9[(ulong)(*(long *)(pBVar8 + ((long)puVar24 - (long)pBVar8 & 0xffffffffU) + 2) *
                          -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = UVar23 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] =
                 ((int)src + -2) - iVar32;
            uVar12 = (uint)local_b8;
            uVar7 = uVar28;
            if ((uint)local_b8 == 0) {
              local_b8 = 0;
            }
            else {
              do {
                uVar28 = uVar12;
                local_b8 = (ulong)uVar7;
                if ((int)*src != *(int *)((long)src - (ulong)uVar28)) {
                  local_b8 = (ulong)uVar28;
                  uVar28 = uVar7;
                  break;
                }
                lVar37 = -(ulong)uVar28;
                puVar24 = (ulong *)((long)src + 4);
                puVar17 = (ulong *)((long)src + lVar37 + 4);
                puVar18 = puVar24;
                if (puVar24 < puVar1) {
                  if (*puVar17 == *puVar24) {
                    lVar38 = 0;
                    do {
                      puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                      if (puVar1 <= puVar18) {
                        puVar17 = (ulong *)((long)src + lVar37 + lVar38 + 0xc);
                        puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                        goto LAB_001c5744;
                      }
                      uVar22 = *(ulong *)((long)src + lVar38 + lVar37 + 0xc);
                      uVar33 = *puVar18;
                      lVar38 = lVar38 + 8;
                    } while (uVar22 == uVar33);
                    uVar33 = uVar33 ^ uVar22;
                    uVar22 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar38;
                  }
                  else {
                    uVar33 = *puVar24 ^ *puVar17;
                    uVar22 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    uVar22 = uVar22 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001c5744:
                  if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar18))
                  {
                    puVar18 = (ulong *)((long)puVar18 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar18 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar17 == (short)*puVar18)) {
                    puVar18 = (ulong *)((long)puVar18 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar18 < puVar2) {
                    puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar17 == (char)*puVar18));
                  }
                  uVar22 = (long)puVar18 - (long)puVar24;
                }
                pUVar9[*src * -0x30e44323405a9d00 >> (bVar20 & 0x3f)] = (int)src - iVar32;
                if (src <= puVar19) {
                  puVar24 = (ulong *)seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar24 = *src;
                  puVar24[1] = uVar33;
                  psVar21 = seqStore->sequences;
                }
                psVar21->litLength = 0;
                psVar21->offset = 1;
                if (0xffff < uVar22 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
                }
                src = (void *)((long)src + uVar22 + 4);
                psVar21->matchLength = (U16)(uVar22 + 1);
                psVar21 = psVar21 + 1;
                seqStore->sequences = psVar21;
                uVar12 = uVar7;
                uVar7 = uVar28;
              } while (src <= puVar15);
            }
          }
          puVar18 = (ulong *)((long)src + 1);
          puVar24 = (ulong *)src;
          local_bc = uVar28;
        }
        uVar28 = (uint)local_b8;
      } while (puVar18 < puVar15);
    }
  }
  else if (puVar18 < puVar15) {
    bVar20 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar2 - 7);
    puVar19 = puVar2 + -4;
    do {
      uVar22 = *puVar24;
      uVar12 = (uint)((int)uVar22 * -0x61c8864f) >> (bVar20 & 0x1f);
      uVar33 = *puVar18;
      uVar29 = (uint)((int)uVar33 * -0x61c8864f) >> (bVar20 & 0x1f);
      uVar28 = pUVar9[uVar12];
      uVar7 = pUVar9[uVar29];
      UVar23 = (U32)((long)puVar24 - (long)pBVar8);
      pUVar9[uVar12] = UVar23;
      pUVar9[uVar29] = (int)puVar18 - iVar32;
      if ((local_bc == 0) ||
         (piVar31 = (int *)((long)puVar24 + (2 - (ulong)local_bc)),
         *piVar31 != *(int *)((long)puVar24 + 2))) {
        if (((uVar13 < uVar28) &&
            (piVar31 = (int *)(pBVar8 + uVar28), puVar17 = puVar24, *piVar31 == (int)uVar22)) ||
           ((uVar13 < uVar7 &&
            (piVar31 = (int *)(pBVar8 + uVar7), puVar17 = puVar18, *piVar31 == (int)uVar33)))) {
          uVar28 = (int)puVar17 - (int)piVar31;
          iVar25 = uVar28 + 2;
          uVar22 = 4;
          while ((piVar26 < piVar31 && (src < puVar17))) {
            if (*(char *)((long)puVar17 + -1) != *(char *)((long)piVar31 + -1)) {
              local_b8 = (ulong)local_bc;
              goto LAB_001c6611;
            }
            uVar22 = uVar22 + 1;
            puVar17 = (ulong *)((long)puVar17 + -1);
            piVar31 = (int *)((long)piVar31 + -1);
          }
          local_b8 = (ulong)local_bc;
          goto LAB_001c6611;
        }
        lVar37 = ((ulong)((long)puVar24 - (long)src) >> 7) + uVar14;
        puVar24 = (ulong *)((long)puVar24 + lVar37);
        puVar18 = (ulong *)((long)puVar18 + lVar37);
      }
      else {
        uVar22 = (ulong)(*(char *)((long)puVar24 + 1) == *(char *)((long)piVar31 + -1));
        puVar17 = (ulong *)((long)puVar24 + (2 - uVar22));
        piVar31 = (int *)((long)piVar31 - uVar22);
        uVar22 = uVar22 | 4;
        iVar25 = 0;
        uVar28 = local_bc;
LAB_001c6611:
        puVar18 = (ulong *)((long)puVar17 + uVar22);
        puVar35 = (ulong *)((long)piVar31 + uVar22);
        puVar34 = puVar18;
        if (puVar18 < puVar1) {
          if (*puVar35 == *puVar18) {
            lVar37 = 0;
            do {
              puVar35 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
              if (puVar1 <= puVar35) {
                puVar35 = (ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
                puVar34 = (ulong *)((long)puVar17 + lVar37 + uVar22 + 8);
                goto LAB_001c6690;
              }
              uVar33 = *(ulong *)((long)piVar31 + lVar37 + uVar22 + 8);
              uVar16 = *puVar35;
              lVar37 = lVar37 + 8;
            } while (uVar33 == uVar16);
            uVar16 = uVar16 ^ uVar33;
            uVar33 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = (uVar33 >> 3 & 0x1fffffff) + lVar37;
          }
          else {
            uVar16 = *puVar18 ^ *puVar35;
            uVar33 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            uVar33 = uVar33 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c6690:
          if ((puVar34 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar35 == (int)*puVar34)) {
            puVar34 = (ulong *)((long)puVar34 + 4);
            puVar35 = (ulong *)((long)puVar35 + 4);
          }
          if ((puVar34 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar35 == (short)*puVar34)) {
            puVar34 = (ulong *)((long)puVar34 + 2);
            puVar35 = (ulong *)((long)puVar35 + 2);
          }
          if (puVar34 < puVar2) {
            puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar35 == (char)*puVar34));
          }
          uVar33 = (long)puVar34 - (long)puVar18;
        }
        uVar16 = (long)puVar17 - (long)src;
        puVar18 = (ulong *)seqStore->lit;
        if (puVar19 < puVar17) {
          puVar35 = puVar18;
          puVar34 = (ulong *)src;
          if (src <= puVar19) {
            puVar35 = (ulong *)((long)puVar18 + ((long)puVar19 - (long)src));
            uVar30 = *(ulong *)((long)src + 8);
            *puVar18 = *src;
            puVar18[1] = uVar30;
            puVar34 = puVar19;
            if (0x10 < (long)puVar19 - (long)src) {
              lVar37 = 0x10;
              do {
                uVar11 = ((undefined8 *)((long)src + lVar37))[1];
                puVar4 = (undefined8 *)((long)puVar18 + lVar37);
                *puVar4 = *(undefined8 *)((long)src + lVar37);
                puVar4[1] = uVar11;
                puVar5 = (undefined8 *)((long)src + lVar37 + 0x10);
                uVar11 = puVar5[1];
                puVar4[2] = *puVar5;
                puVar4[3] = uVar11;
                lVar37 = lVar37 + 0x20;
              } while (puVar4 + 4 < puVar35);
            }
          }
          if (puVar34 < puVar17) {
            lVar37 = 0;
            do {
              *(undefined1 *)((long)puVar35 + lVar37) = *(undefined1 *)((long)puVar34 + lVar37);
              lVar37 = lVar37 + 1;
            } while ((long)puVar17 - (long)puVar34 != lVar37);
          }
LAB_001c67e3:
          seqStore->lit = seqStore->lit + uVar16;
          psVar21 = seqStore->sequences;
          if (0xffff < uVar16) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar30 = *(ulong *)((long)src + 8);
          *puVar18 = *src;
          puVar18[1] = uVar30;
          pBVar10 = seqStore->lit;
          if (0x10 < uVar16) {
            uVar30 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar10 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar10 + 0x18) = uVar30;
            if (0x20 < (long)uVar16) {
              lVar37 = 0;
              do {
                puVar4 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar11 = puVar4[1];
                pBVar3 = pBVar10 + lVar37 + 0x20;
                *(undefined8 *)pBVar3 = *puVar4;
                *(undefined8 *)(pBVar3 + 8) = uVar11;
                puVar4 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar11 = puVar4[1];
                *(undefined8 *)(pBVar3 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar3 + 0x18) = uVar11;
                lVar37 = lVar37 + 0x20;
              } while (pBVar3 + 0x20 < pBVar10 + uVar16);
            }
            goto LAB_001c67e3;
          }
          seqStore->lit = pBVar10 + uVar16;
          psVar21 = seqStore->sequences;
        }
        uVar30 = (uVar33 + uVar22) - 3;
        psVar21->litLength = (U16)uVar16;
        psVar21->offset = iVar25 + 1;
        if (0xffff < uVar30) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar21->matchLength = (U16)uVar30;
        psVar21 = psVar21 + 1;
        seqStore->sequences = psVar21;
        src = (void *)((long)puVar17 + uVar33 + uVar22);
        if (src <= puVar15) {
          pUVar9[(uint)(*(int *)(pBVar8 + ((long)puVar24 - (long)pBVar8 & 0xffffffffU) + 2) *
                       -0x61c8864f) >> (bVar20 & 0x1f)] = UVar23 + 2;
          pUVar9[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar20 & 0x1f)] =
               ((int)src + -2) - iVar32;
          if ((int)local_b8 == 0) {
            local_b8 = 0;
          }
          else {
            uVar22 = (ulong)uVar28;
            do {
              uVar33 = local_b8;
              local_b8 = uVar33;
              uVar28 = (uint)uVar22;
              if ((int)*src != *(int *)((long)src - uVar33)) break;
              lVar37 = -uVar33;
              puVar24 = (ulong *)((long)src + 4);
              puVar17 = (ulong *)((long)src + lVar37 + 4);
              puVar18 = puVar24;
              if (puVar24 < puVar1) {
                if (*puVar17 == *puVar24) {
                  lVar38 = 0;
                  do {
                    puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                    if (puVar1 <= puVar18) {
                      puVar17 = (ulong *)((long)src + lVar37 + lVar38 + 0xc);
                      puVar18 = (ulong *)((long)src + lVar38 + 0xc);
                      goto LAB_001c696a;
                    }
                    uVar16 = *(ulong *)((long)src + lVar38 + lVar37 + 0xc);
                    uVar30 = *puVar18;
                    lVar38 = lVar38 + 8;
                  } while (uVar16 == uVar30);
                  uVar30 = uVar30 ^ uVar16;
                  uVar16 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar30 = *puVar24 ^ *puVar17;
                  uVar16 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c696a:
                if ((puVar18 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar17 == (int)*puVar18)) {
                  puVar18 = (ulong *)((long)puVar18 + 4);
                  puVar17 = (ulong *)((long)puVar17 + 4);
                }
                if ((puVar18 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar17 == (short)*puVar18)
                   ) {
                  puVar18 = (ulong *)((long)puVar18 + 2);
                  puVar17 = (ulong *)((long)puVar17 + 2);
                }
                if (puVar18 < puVar2) {
                  puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar17 == (char)*puVar18));
                }
                uVar16 = (long)puVar18 - (long)puVar24;
              }
              pUVar9[(uint)((int)*src * -0x61c8864f) >> (bVar20 & 0x1f)] = (int)src - iVar32;
              if (src <= puVar19) {
                puVar24 = (ulong *)seqStore->lit;
                uVar30 = *(ulong *)((long)src + 8);
                *puVar24 = *src;
                puVar24[1] = uVar30;
                psVar21 = seqStore->sequences;
              }
              psVar21->litLength = 0;
              psVar21->offset = 1;
              if (0xffff < uVar16 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar21 - (long)seqStore->sequencesStart) >> 3);
              }
              src = (void *)((long)src + uVar16 + 4);
              psVar21->matchLength = (U16)(uVar16 + 1);
              psVar21 = psVar21 + 1;
              seqStore->sequences = psVar21;
              local_b8 = uVar22;
              uVar22 = uVar33;
              uVar28 = (uint)uVar33;
            } while (src <= puVar15);
          }
        }
        puVar18 = (ulong *)((long)src + 1);
        puVar24 = (ulong *)src;
        local_bc = uVar28;
      }
      uVar28 = (uint)local_b8;
    } while (puVar18 < puVar15);
  }
  uVar13 = 0;
  if (uVar36 < uVar6) {
    uVar13 = uVar6;
  }
  if (uVar36 < uVar27) {
    uVar13 = uVar27;
  }
  if (local_bc == 0) {
    local_bc = uVar13;
  }
  if (uVar28 != 0) {
    uVar13 = uVar28;
  }
  *rep = local_bc;
  rep[1] = uVar13;
  return (long)puVar2 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}